

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirDependsCommand.h
# Opt level: O0

cmCommand * __thiscall cmSubdirDependsCommand::Clone(cmSubdirDependsCommand *this)

{
  cmCommand *this_00;
  cmSubdirDependsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSubdirDependsCommand((cmSubdirDependsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmSubdirDependsCommand; }